

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logger.cpp
# Opt level: O2

void pobr::utils::Logger::warning(string *message)

{
  allocator local_4a;
  allocator local_49;
  string local_48;
  string local_28;
  
  std::__cxx11::string::string((string *)&local_48,"Warn",&local_4a);
  std::__cxx11::string::string((string *)&local_28,"yellow",&local_49);
  TerminalPrinter::printLabel(&local_48,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::string((string *)&local_48,"Warn",&local_4a);
  local_28._M_dataplus._M_p._0_4_ = TerminalPrinter::getLabelLength(&local_48);
  print((uint *)&local_28,message);
  std::__cxx11::string::~string((string *)&local_48);
  return;
}

Assistant:

void Logger::warning(const std::string& message)
{
    Logger::printLabel("Warn", "yellow");
    Logger::print(Logger::getLabelLength("Warn"), message);
}